

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void * btreeblk_move(void *voidhandle,bid_t bid,bid_t *new_bid)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  bid_t *in_RDX;
  bid_t in_RSI;
  uint *in_RDI;
  int convert_to_normal;
  size_t new_sb_idx;
  size_t old_sb_idx;
  size_t sb;
  int subblock;
  int i;
  bid_t _new_bid;
  bid_t _old_bid;
  void *new_addr;
  void *old_addr;
  btreeblk_handle *handle;
  bid_t *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  int iVar4;
  size_t local_68;
  bid_t bid_00;
  filemgr *file;
  int iVar5;
  void *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  void *local_38;
  int sb_no;
  uint *bid_01;
  void *in_stack_fffffffffffffff8;
  
  bid_00 = 0;
  file = (filemgr *)0x0;
  bid_01 = in_RDI;
  subbid2bid(in_RSI,(size_t *)&stack0xffffffffffffffa8,(size_t *)&stack0xffffffffffffffa0,
             (bid_t *)&stack0xffffffffffffffc0);
  iVar1 = is_subblock(in_RSI);
  sb_no = (int)(in_RSI >> 0x20);
  iVar4 = 0;
  if (iVar1 == 0) {
    pvVar3 = btreeblk_read((void *)(ulong)in_stack_ffffffffffffff90,(bid_t)in_stack_ffffffffffffff88
                          );
    local_38 = btreeblk_alloc((void *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88);
    *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + -1;
    memcpy(local_38,pvVar3,(ulong)*in_RDI);
    _btreeblk_add_stale_block
              ((btreeblk_handle *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
               (uint64_t)in_stack_ffffffffffffff88,0);
  }
  else {
    pvVar3 = _btreeblk_read(in_stack_fffffffffffffff8,(bid_t)bid_01,sb_no);
    local_68 = (size_t)*(ushort *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0xc);
    for (iVar5 = 0;
        iVar5 < (int)(uint)*(ushort *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0xc);
        iVar5 = iVar5 + 1) {
      if (*(char *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0x10) + (long)iVar5) ==
          '\0') {
        local_68 = (size_t)iVar5;
        break;
      }
    }
    if ((((*(long *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18) == -1) ||
         (local_68 == *(ushort *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0xc))) ||
        (iVar2 = filemgr_is_writable(file,bid_00), iVar2 == 0)) || (iVar4 != 0)) {
      if (*(long *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18) != -1) {
        for (iVar5 = 0;
            iVar5 < (int)(uint)*(ushort *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0xc);
            iVar5 = iVar5 + 1) {
          if (*(char *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0x10) + (long)iVar5
                       ) == '\0') {
            _btreeblk_add_stale_block
                      ((btreeblk_handle *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                       (uint64_t)in_stack_ffffffffffffff88,0);
          }
        }
      }
      if (iVar4 == 0) {
        local_38 = _btreeblk_alloc(in_stack_ffffffffffffffb8,(bid_t *)CONCAT44(iVar5,iVar1),
                                   (int)((ulong)file >> 0x20));
        *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + -1;
        *(void **)(*(long *)(in_RDI + 0x18) + (long)file * 0x18) = in_stack_ffffffffffffffb8;
        memset(*(void **)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0x10),0,
               (ulong)*(ushort *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0xc));
      }
      else {
        local_38 = btreeblk_alloc((void *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88);
        *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + -1;
      }
      local_68 = 0;
    }
    else {
      local_38 = _btreeblk_read(in_stack_fffffffffffffff8,(bid_t)bid_01,sb_no);
    }
    if (iVar4 == 0) {
      *(undefined1 *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 0x10) + local_68) = 1
      ;
      bid2subbid(*(bid_t *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18),(size_t)file,local_68,
                 in_RDX);
      btreeblk_set_dirty(in_stack_ffffffffffffffc0,(bid_t)in_stack_ffffffffffffffb8);
    }
    else {
      *in_RDX = (bid_t)in_stack_ffffffffffffffb8;
    }
    memcpy((void *)((long)local_38 +
                   *(uint *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 8) * local_68),
           (void *)((long)pvVar3 +
                   *(uint *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 8) * bid_00),
           (ulong)*(uint *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 8));
    _btreeblk_add_stale_block
              ((btreeblk_handle *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
               (uint64_t)in_stack_ffffffffffffff88,0);
    local_38 = (void *)((long)local_38 +
                       *(uint *)(*(long *)(in_RDI + 0x18) + (long)file * 0x18 + 8) * local_68);
  }
  return local_38;
}

Assistant:

void * btreeblk_move(void *voidhandle, bid_t bid, bid_t *new_bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    void *old_addr, *new_addr;
    bid_t _old_bid, _new_bid;
    int i, subblock;
    size_t sb, old_sb_idx, new_sb_idx;

    old_addr = new_addr = NULL;
    sb = old_sb_idx = 0;
    subbid2bid(bid, &sb, &old_sb_idx, &_old_bid);
    subblock = is_subblock(bid);

    int convert_to_normal = 0;
#ifndef __BTREEBLK_SUBBLOCK
    convert_to_normal = 1;
#endif

    if (!subblock) {
        // normal block
        old_addr = btreeblk_read(voidhandle, bid);
        new_addr = btreeblk_alloc(voidhandle, new_bid);
        handle->nlivenodes--;

        // move
        memcpy(new_addr, old_addr, (handle->nodesize));

        // the entire block becomes stale
        _btreeblk_add_stale_block(handle, bid * handle->nodesize, handle->nodesize);

        return new_addr;
    } else {
        // subblock

        // move the target subblock
        // into the current subblock set
        old_addr = _btreeblk_read(voidhandle, _old_bid, sb);

        new_sb_idx = handle->sb[sb].nblocks;
        for (i=0;i<handle->sb[sb].nblocks;++i){
            if (handle->sb[sb].bitmap[i] == 0) {
                new_sb_idx = i;
                break;
            }
        }
        if ( handle->sb[sb].bid == BLK_NOT_FOUND ||
             new_sb_idx == handle->sb[sb].nblocks ||
             !filemgr_is_writable(handle->file, handle->sb[sb].bid) ||
             convert_to_normal ) {
            // There is no free slot in the parent block, OR
            // the parent block is not writable, OR
            // `convert_to_normal` flag is on.

            // Mark all unused subblocks in the current parent block as stale
            if (handle->sb[sb].bid != BLK_NOT_FOUND) {
                for (i=0; i<handle->sb[sb].nblocks; ++i) {
                    if (handle->sb[sb].bitmap[i] == 0) {
                        _btreeblk_add_stale_block
                        ( handle,
                          ( (handle->sb[sb].bid * handle->nodesize) +
                            (i * handle->sb[sb].sb_size) ),
                          handle->sb[sb].sb_size );
                    }
                }
            }

            if (convert_to_normal) {
                // Whole block.
                new_addr = btreeblk_alloc(voidhandle, &_new_bid);
                handle->nlivenodes--;
            } else {
                // Allocate new parent block.
                new_addr = _btreeblk_alloc(voidhandle, &_new_bid, sb);
                handle->nlivenodes--;
                handle->sb[sb].bid = _new_bid;
                memset(handle->sb[sb].bitmap, 0, handle->sb[sb].nblocks);
            }
            new_sb_idx = 0;

        } else {
            // just append to the current block
            new_addr = _btreeblk_read(voidhandle, handle->sb[sb].bid, sb);
        }

        if (convert_to_normal) {
            *new_bid = _new_bid;
        } else {
            handle->sb[sb].bitmap[new_sb_idx] = 1;
            bid2subbid(handle->sb[sb].bid, sb, new_sb_idx, new_bid);
            btreeblk_set_dirty(voidhandle, handle->sb[sb].bid);
        }

        // move
        memcpy( (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx,
                (uint8_t*)old_addr + handle->sb[sb].sb_size * old_sb_idx,
                handle->sb[sb].sb_size );

        // Also mark the target (old) subblock as stale
        _btreeblk_add_stale_block
        ( handle,
          (_old_bid * handle->nodesize) + (old_sb_idx * handle->sb[sb].sb_size),
           handle->sb[sb].sb_size );

        return (uint8_t*)new_addr + handle->sb[sb].sb_size * new_sb_idx;
    }
}